

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QList<QtPromise::QPromise<int>_>_>::notify
          (PromiseData<QList<QtPromise::QPromise<int>_>_> *this,QVector<Handler> *handlers)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  type local_98;
  function<void_(const_QList<QtPromise::QPromise<int>_>_&)> *local_68;
  function<void_(const_QList<QtPromise::QPromise<int>_>_&)> *fn;
  pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_> *handler;
  pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_> *local_48
  ;
  const_iterator local_40;
  const_iterator __end0;
  const_iterator __begin0;
  QVector<Handler> *__range2;
  PromiseValue<QList<QtPromise::QPromise<int>_>_> value;
  QVector<Handler> *handlers_local;
  PromiseData<QList<QtPromise::QPromise<int>_>_> *this_local;
  
  value.m_data.super___shared_ptr<QList<QtPromise::QPromise<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handlers;
  PromiseValue<QList<QtPromise::QPromise<int>_>_>::PromiseValue
            ((PromiseValue<QList<QtPromise::QPromise<int>_>_> *)&__range2,&this->m_value);
  this_00._M_pi =
       value.m_data.super___shared_ptr<QList<QtPromise::QPromise<int>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  __end0 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
           ::begin((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
                    *)value.m_data.
                      super___shared_ptr<QList<QtPromise::QPromise<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
  local_40 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
             ::end((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
                    *)this_00._M_pi);
  while( true ) {
    local_48 = local_40.i;
    bVar1 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
            ::const_iterator::operator!=(&__end0,local_40);
    if (!bVar1) break;
    fn = (function<void_(const_QList<QtPromise::QPromise<int>_>_&)> *)
         QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
         ::const_iterator::operator*(&__end0);
    local_68 = &((pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>
                  *)fn)->second;
    std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>::function
              ((function<void_(const_QList<QtPromise::QPromise<int>_>_&)> *)&local_98,local_68);
    PromiseValue<QList<QtPromise::QPromise<int>_>_>::PromiseValue
              ((PromiseValue<QList<QtPromise::QPromise<int>_>_> *)&local_98.value,
               (PromiseValue<QList<QtPromise::QPromise<int>_>_> *)&__range2);
    qtpromise_defer<QtPromisePrivate::PromiseData<QList<QtPromise::QPromise<int>>>::notify(QList<std::pair<QPointer<QThread>,std::function<void(QList<QtPromise::QPromise<int>>const&)>>>const&)::_lambda()_1_>
              (&local_98,(QPointer<QThread> *)fn);
    PromiseData<QList<QtPromise::QPromise<int>>>::
    notify(QList<std::pair<QPointer<QThread>,std::function<void(QList<QtPromise::QPromise<int>>const&)>>>const&)
    ::{lambda()#1}::~notify((_lambda___1_ *)&local_98);
    QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QtPromise::QPromise<int>_>_&)>_>_>
    ::const_iterator::operator++(&__end0);
  }
  PromiseValue<QList<QtPromise::QPromise<int>_>_>::~PromiseValue
            ((PromiseValue<QList<QtPromise::QPromise<int>_>_> *)&__range2);
  return;
}

Assistant:

void notify(const QVector<Handler>& handlers) Q_DECL_OVERRIDE
    {
        PromiseValue<T> value = m_value;
        Q_ASSERT(!value.isNull());

        for (const auto& handler : handlers) {
            const auto& fn = handler.second;
            qtpromise_defer(
                [=]() {
                    fn(value.data());
                },
                handler.first);
        }
    }